

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O2

void __thiscall w3Interp::i64_Load16s(w3Interp *this)

{
  short *psVar1;
  
  psVar1 = (short *)LoadStore(this,2);
  w3Stack::push_i64(&this->super_w3Stack,(long)*psVar1);
  return;
}

Assistant:

INTERP (i64_Load16s)
{
    push_i64 (*(int16_t*)LoadStore (2));
}